

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O1

int OPENSSL_fromxdigit(uint8_t *out,int c)

{
  char cVar1;
  
  cVar1 = -0x30;
  if (((c - 0x3aU < 0xfffffff6) && (cVar1 = -0x57, 5 < c - 0x61U)) && (cVar1 = -0x37, 5 < c - 0x41U)
     ) {
    return 0;
  }
  *out = (char)c + cVar1;
  return 1;
}

Assistant:

int OPENSSL_fromxdigit(uint8_t *out, int c) {
  if (OPENSSL_isdigit(c)) {
    *out = c - '0';
    return 1;
  }
  if ('a' <= c && c <= 'f') {
    *out = c - 'a' + 10;
    return 1;
  }
  if ('A' <= c && c <= 'F') {
    *out = c - 'A' + 10;
    return 1;
  }
  return 0;
}